

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_screens.cpp
# Opt level: O0

void __thiscall QXcbConnection::destroyScreen(QXcbConnection *this,QXcbScreen *screen)

{
  bool bVar1;
  QXcbScreen *this_00;
  xcb_randr_get_output_info_reply_t *outputInfo;
  QDebug *pQVar2;
  const_reference ppQVar3;
  qsizetype qVar4;
  QXcbScreen *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int idx;
  QXcbVirtualDesktop *virtualDesktop;
  QXcbScreen *newPrimary;
  QString nameWas;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QXcbVirtualDesktop *in_stack_fffffffffffffed8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  xcb_randr_output_t in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff28;
  QDebug local_d0;
  QDebug local_c8;
  QDebug local_c0 [4];
  QLoggingCategoryMacroHolder<(QtMsgType)0> *local_a0;
  QDebug local_78;
  QDebug in_stack_ffffffffffffff90;
  QDebug in_stack_ffffffffffffff98;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  QList<QPlatformScreen_*> local_48;
  QXcbScreen *local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RSI;
  this_00 = (QXcbScreen *)QXcbScreen::virtualDesktop(in_RSI);
  QXcbVirtualDesktop::screens(in_stack_fffffffffffffed8);
  outputInfo = (xcb_randr_get_output_info_reply_t *)QList<QPlatformScreen_*>::size(&local_48);
  QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x16d656);
  if (outputInfo == (xcb_randr_get_output_info_reply_t *)0x1) {
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)local_30 + 0x90))(&local_60);
    QXcbScreen::setOutput(this_00,in_stack_fffffffffffffefc,outputInfo);
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaScreen();
    anon_unknown.dwarf_1101ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffee0,(QLoggingCategory *)in_stack_fffffffffffffed8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_1101ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x16d714);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)outputInfo,(char *)in_RDI,
                 (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8,
                 (char *)0x16d72d);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_ffffffffffffff28);
      QDebug::operator<<((QDebug *)outputInfo,in_RDI);
      pQVar2 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                  in_stack_ffffffffffffff28);
      QDebug::QDebug((QDebug *)&stack0xffffffffffffff90,pQVar2);
      ::operator<<((QDebug *)in_stack_ffffffffffffff98.stream,
                   (QXcbScreen *)in_stack_ffffffffffffff90.stream);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff98);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff90);
      QDebug::~QDebug(&local_78);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    QString::~QString((QString *)0x16d7e3);
  }
  else {
    QList<QXcbScreen*>::removeOne<QXcbScreen*>
              ((QList<QXcbScreen_*> *)in_stack_fffffffffffffee0,
               (QXcbScreen **)in_stack_fffffffffffffed8);
    QXcbVirtualDesktop::removeScreen
              ((QXcbVirtualDesktop *)0x16d813,(QPlatformScreen *)in_stack_fffffffffffffed8);
    bVar1 = QXcbScreen::isPrimary(local_30);
    if (bVar1) {
      QXcbVirtualDesktop::screens(in_stack_fffffffffffffed8);
      ppQVar3 = QList<QPlatformScreen_*>::at
                          ((QList<QPlatformScreen_*> *)in_stack_fffffffffffffee0,
                           (qsizetype)in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)*ppQVar3;
      QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x16d858);
      local_a0 = in_stack_fffffffffffffee0;
      QXcbScreen::setPrimary((QXcbScreen *)in_stack_fffffffffffffee0,true);
      qVar4 = QListSpecialMethodsBase<QXcbScreen*>::indexOf<QXcbScreen*>
                        ((QListSpecialMethodsBase<QXcbScreen_*> *)in_stack_fffffffffffffee0,
                         (QXcbScreen **)in_stack_fffffffffffffed8,0x16d894);
      in_stack_fffffffffffffefc = (xcb_randr_output_t)qVar4;
      if (0 < (int)in_stack_fffffffffffffefc) {
        QList<QXcbScreen_*>::swapItemsAt
                  ((QList<QXcbScreen_*> *)outputInfo,(qsizetype)in_RDI,
                   (qsizetype)in_stack_fffffffffffffee0);
      }
      QWindowSystemInterface::handlePrimaryScreenChanged((QPlatformScreen *)local_a0);
    }
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaScreen();
    anon_unknown.dwarf_1101ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffee0,(QLoggingCategory *)in_stack_fffffffffffffed8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_1101ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x16d91c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)outputInfo,(char *)in_RDI,
                 (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8,
                 (char *)0x16d932);
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                  in_stack_ffffffffffffff28);
      QDebug::QDebug(&local_c8,pQVar2);
      ::operator<<((QDebug *)in_stack_ffffffffffffff98.stream,
                   (QXcbScreen *)in_stack_ffffffffffffff90.stream);
      QDebug::~QDebug(local_c0);
      QDebug::~QDebug(&local_c8);
      QDebug::~QDebug(&local_d0);
      local_20 = local_20 & 0xffffffffffffff00;
    }
    QWindowSystemInterface::handleScreenRemoved((QPlatformScreen *)local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbConnection::destroyScreen(QXcbScreen *screen)
{
    QXcbVirtualDesktop *virtualDesktop = screen->virtualDesktop();
    if (virtualDesktop->screens().size() == 1) {
        // If there are no other screens on the same virtual desktop,
        // then transform the physical screen into a fake screen.
        const QString nameWas = screen->name();
        screen->setOutput(XCB_NONE, nullptr);
        qCDebug(lcQpaScreen) << "transformed" << nameWas << "to fake" << screen;
    } else {
        // There is more than one screen on the same virtual desktop, remove the screen
        m_screens.removeOne(screen);
        virtualDesktop->removeScreen(screen);

        // When primary screen is removed, set the new primary screen
        // which belongs to the primary virtual desktop.
        if (screen->isPrimary()) {
            QXcbScreen *newPrimary = static_cast<QXcbScreen *>(virtualDesktop->screens().at(0));
            newPrimary->setPrimary(true);
            const int idx = m_screens.indexOf(newPrimary);
            if (idx > 0)
                m_screens.swapItemsAt(0, idx);
            QWindowSystemInterface::handlePrimaryScreenChanged(newPrimary);
        }

        qCDebug(lcQpaScreen) << "destroyScreen: destroy" << screen;
        QWindowSystemInterface::handleScreenRemoved(screen);
    }
}